

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_command_queue xmrig::OclLib::createCommandQueue(cl_context context,cl_device_id device)

{
  cl_command_queue p_Var1;
  runtime_error *this;
  char *pcVar2;
  cl_device_id in_RSI;
  cl_context in_RDI;
  cl_command_queue queue;
  cl_int ret;
  undefined4 in_stack_ffffffffffffffe8;
  cl_int in_stack_ffffffffffffffec;
  
  p_Var1 = createCommandQueue(in_RDI,in_RSI,
                              (cl_int *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (in_stack_ffffffffffffffec != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar2 = OclError::toString(in_stack_ffffffffffffffec);
    std::runtime_error::runtime_error(this,pcVar2);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return p_Var1;
}

Assistant:

cl_command_queue xmrig::OclLib::createCommandQueue(cl_context context, cl_device_id device)
{
    cl_int ret;
    cl_command_queue queue = createCommandQueue(context, device, &ret);
    if (ret != CL_SUCCESS) {
        throw std::runtime_error(OclError::toString(ret));
    }

    return queue;
}